

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::AddRecursiveImportError(google::protobuf::FileDescriptorProto_const&,int)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  long lVar1;
  ulong uVar2;
  allocator<char> local_31;
  
  lVar1 = *(long *)(this + 8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"File recursively imports itself: ",&local_31);
  for (uVar2 = (ulong)**(int **)this;
      uVar2 < (ulong)((*(long **)(lVar1 + 8))[1] - **(long **)(lVar1 + 8) >> 5); uVar2 = uVar2 + 1)
  {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}